

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutils.h
# Opt level: O0

void least_squares_accumulate(double *mat,double *y,double *a,double b,int n)

{
  int iVar1;
  int i_1;
  int j;
  int i;
  int n_local;
  double b_local;
  double *a_local;
  double *y_local;
  double *mat_local;
  
  for (i = 0; i < n; i = i + 1) {
    for (j = 0; j < n; j = j + 1) {
      iVar1 = i * n + j;
      mat[iVar1] = a[i] * a[j] + mat[iVar1];
    }
  }
  for (i_1 = 0; i_1 < n; i_1 = i_1 + 1) {
    y[i_1] = a[i_1] * b + y[i_1];
  }
  return;
}

Assistant:

static inline void least_squares_accumulate(double *mat, double *y,
                                            const double *a, double b, int n) {
  for (int i = 0; i < n; i++) {
    for (int j = 0; j < n; j++) {
      mat[i * n + j] += a[i] * a[j];
    }
  }
  for (int i = 0; i < n; i++) {
    y[i] += a[i] * b;
  }
}